

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  uint *puVar5;
  float *pfVar6;
  Layer *pLVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [32];
  undefined8 uVar26;
  undefined1 uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  undefined4 *puVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  uint _elempack;
  int iVar38;
  ulong uVar39;
  int iVar40;
  float fVar41;
  undefined4 uVar42;
  long lVar43;
  uint uVar44;
  int iVar45;
  undefined1 (*pauVar46) [16];
  undefined1 (*pauVar47) [16];
  Option *opt_00;
  int iVar48;
  float *pfVar49;
  int iVar50;
  bool bVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar70;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar69;
  undefined1 auVar67 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  float fVar96;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar97;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  v4sf one;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [64];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  int local_320;
  ulong local_308;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  size_t local_2a8;
  float *local_298;
  ulong local_290;
  ulong local_288;
  long local_280;
  Mat local_278;
  Mat local_228;
  ulong local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [56];
  int local_190;
  size_t local_188;
  pointer local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  int local_160;
  Allocator *local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined4 local_140;
  ulong local_138;
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  int local_110;
  Allocator *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined4 local_f0;
  ulong local_e8;
  size_type local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar10;
  undefined3 uVar12;
  undefined2 uVar14;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  
  local_1c8._24_4_ = bottom_blob->elempack;
  local_190 = bottom_blob->c;
  if (local_1c8._24_4_ == 0) {
    bVar51 = false;
  }
  else {
    bVar51 = ((int)bottom_blob->elemsize << 3) / (int)local_1c8._24_4_ == 8;
  }
  iVar38 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar48 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar40 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar29 = (this->super_ConvolutionDepthWise).dilation_h;
  piVar1 = bottom_blob->refcount;
  local_1c8._0_8_ = bottom_blob->data;
  local_1c8._8_4_ = SUB84(bottom_blob->refcount,0);
  local_1c8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_1c8._16_8_ = bottom_blob->elemsize;
  local_1c8._32_8_ = bottom_blob->allocator;
  local_1c8._40_4_ = bottom_blob->dims;
  local_1c8._44_4_ = bottom_blob->w;
  local_1c8._48_4_ = bottom_blob->h;
  local_1c8._52_4_ = bottom_blob->d;
  local_188 = bottom_blob->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  if (!bVar51) {
    uVar36 = (long)(local_1c8._24_4_ * local_190) / (long)(this->super_ConvolutionDepthWise).group;
    local_278.cstep = 0;
    local_278.data = (undefined4 *)0x0;
    local_278.refcount._0_4_ = 0;
    local_278.refcount._4_4_ = 0;
    local_278.elemsize = 0;
    local_278.elempack = 0;
    local_278.allocator = (Allocator *)0x0;
    local_278.dims = 0;
    local_278.w = 0;
    local_278.h = 0;
    local_278.d = 0;
    local_278.c = 0;
    Mat::create(&local_278,local_1c8._24_4_ * local_190,4,(Allocator *)0x0);
    lVar31 = (long)(this->super_ConvolutionDepthWise).group;
    if (0 < lVar31) {
      pvVar2 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
      lVar43 = 0;
      puVar33 = (undefined4 *)local_278.data;
      do {
        if (0 < (int)uVar36) {
          uVar42 = *(undefined4 *)((long)pvVar2 + lVar43 * 4);
          uVar34 = uVar36 & 0xffffffff;
          do {
            *puVar33 = uVar42;
            puVar33 = puVar33 + 1;
            uVar44 = (int)uVar34 - 1;
            uVar34 = (ulong)uVar44;
          } while (uVar44 != 0);
        }
        lVar43 = lVar43 + 1;
      } while (lVar43 != lVar31);
    }
    local_2e8._0_8_ = *(undefined8 *)opt;
    uVar8 = opt->openmp_blocktime;
    uVar9 = opt->use_winograd_convolution;
    uVar11 = opt->use_sgemm_convolution;
    uVar13 = opt->use_int8_inference;
    uVar15 = opt->use_vulkan_compute;
    uVar14 = CONCAT11(uVar15,uVar13);
    uVar12 = CONCAT21(uVar14,uVar11);
    uVar10 = CONCAT31(uVar12,uVar9);
    local_2c8[0] = opt->use_bf16_storage;
    local_2c8[1] = opt->use_fp16_packed;
    local_2c8[2] = opt->use_fp16_storage;
    local_2c8[3] = opt->use_fp16_arithmetic;
    local_2c8[4] = opt->use_int8_packed;
    local_2c8[5] = opt->use_int8_storage;
    local_2c8[6] = opt->use_int8_arithmetic;
    local_2c8[7] = opt->use_packing_layout;
    local_2c8._8_4_ = opt->vulkan_device_index;
    local_2c8[0xc] = opt->use_reserved_1;
    local_2c8[0xd] = opt->use_image_storage;
    local_2c8[0xe] = opt->use_tensor_storage;
    local_2c8[0xf] = opt->use_reserved_2;
    local_2c8._16_4_ = opt->flush_denormals;
    local_2c8[0x14] = opt->use_local_pool_allocator;
    local_2c8[0x15] = opt->use_shader_local_memory;
    local_2c8[0x16] = opt->use_cooperative_matrix;
    local_2c8[0x17] = opt->use_winograd23_convolution;
    local_2c8[0x18] = opt->use_winograd43_convolution;
    local_2c8[0x19] = opt->use_winograd63_convolution;
    local_2c8[0x1a] = opt->use_a53_a55_optimized_kernel;
    local_2c8[0x1b] = opt->use_fp16_uniform;
    local_2c8[0x1c] = opt->use_int8_uniform;
    local_2c8[0x1d] = opt->use_reserved_9;
    local_2c8[0x1e] = opt->use_reserved_10;
    local_2c8[0x1f] = opt->use_reserved_11;
    local_2e8._16_4_ = SUB84(opt->workspace_allocator,0);
    local_2e8._20_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_2e8._8_4_ = SUB84(opt->workspace_allocator,0);
    local_2e8._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_2e8._24_4_ = uVar8;
    local_2e8._28_4_ = uVar10;
    quantize_to_int8(bottom_blob,(Mat *)local_1c8,&local_278,(Option *)local_2e8);
    bVar51 = (void *)local_1c8._0_8_ == (void *)0x0;
    lVar31 = (long)local_190 * local_188;
    piVar1 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_278.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_278.data != (undefined4 *)0x0) {
            free(local_278.data);
          }
        }
        else {
          (*(local_278.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_320 = -100;
    if (bVar51 || lVar31 == 0) goto LAB_0042b58c;
  }
  local_278.cstep = 0;
  local_278.data = (pointer)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize = 0;
  local_278.elempack = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  ConvolutionDepthWise::make_padding
            (&this->super_ConvolutionDepthWise,(Mat *)local_1c8,&local_278,opt);
  iVar30 = local_278.c;
  iVar50 = local_278.elempack;
  if (((pointer)local_278.data == (pointer)0x0) || ((long)local_278.c * local_278.cstep == 0)) {
    local_320 = -100;
  }
  else {
    uVar34 = (ulong)(uint)local_278.c;
    iVar38 = (~((iVar38 + -1) * iVar40) + local_278.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar40 = iVar38 + 1;
    uVar36 = (long)(~((iVar48 + -1) * iVar29) + local_278.h) /
             (long)(this->super_ConvolutionDepthWise).stride_h;
    local_1d0 = uVar36 & 0xffffffff;
    iVar48 = (int)uVar36 + 1;
    uVar37 = local_278.c * local_278.elempack;
    uVar44 = (this->super_ConvolutionDepthWise).group;
    if ((uVar37 == uVar44) &&
       (uVar28 = (this->super_ConvolutionDepthWise).num_output, uVar44 == uVar28)) {
      local_280 = CONCAT44(local_280._4_4_,local_278.w);
      local_320 = -100;
      uVar44 = 8;
      if (opt->use_packing_layout == false) {
        uVar44 = 1;
      }
      if ((uVar28 & 7) != 0) {
        uVar44 = 1;
      }
      iVar29 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar37 = uVar44 * 4;
      if (100 < iVar29) {
        uVar37 = uVar44;
      }
      Mat::create(top_blob,iVar40,iVar48,(int)uVar28 / (int)uVar44,(ulong)uVar37,uVar44,
                  opt->blob_allocator);
      local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
      if ((top_blob->data != (void *)0x0) &&
         (local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_),
         (long)top_blob->c * top_blob->cstep != 0)) {
        if (iVar50 == 1) {
          iVar48 = (this->super_ConvolutionDepthWise).kernel_w;
          uVar44 = (this->super_ConvolutionDepthWise).kernel_h;
          opt_00 = (Option *)(ulong)uVar44;
          auVar102._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
          auVar102._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
          auVar102._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
          auVar102._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
          auVar103._8_4_ = 1;
          auVar103._0_8_ = 0x100000001;
          auVar103._12_4_ = 1;
          uVar37 = (this->super_ConvolutionDepthWise).activation_type;
          auVar56._0_8_ = auVar102._0_8_ ^ 0x100000001;
          auVar56._8_4_ = auVar102._8_4_ ^ 1;
          auVar56._12_4_ = auVar102._12_4_ ^ 1;
          if ((1 < uVar37 || (uVar44 != 3 || iVar48 != 3)) || auVar56 != (undefined1  [16])0x0) {
            auVar103 = vpcmpeqd_avx(auVar102,auVar103);
            uVar42 = vmovmskps_avx(auVar103);
            if (((uVar44 == 3 && iVar48 == 3) && uVar37 < 2) &&
                ((auVar102._12_4_ == 2 && auVar102._8_4_ == 2) && (~(byte)uVar42 & 3) == 0)) {
              if (iVar29 < 0x65) {
                local_2e8._0_8_ = (pointer)0x0;
                local_2e8._8_8_ = (Allocator *)0x0;
                local_2e8._16_4_ = 0;
                local_2e8._20_4_ = 0;
                if (0 < (this->super_ConvolutionDepthWise).group) {
                  lVar31 = 0;
                  local_2e8._8_8_ = (float *)0x0;
                  do {
                    fVar41 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                     weight_data_int8_scales.data + lVar31 * 4) *
                                   *(float *)((long)(this->super_ConvolutionDepthWise).
                                                    bottom_blob_int8_scales.data + lVar31 * 4));
                    local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar41);
                    if ((float *)local_2e8._8_8_ ==
                        (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                ((vector<float,std::allocator<float>> *)local_2e8,
                                 (iterator)local_2e8._8_8_,(float *)&local_228);
                    }
                    else {
                      *(float *)local_2e8._8_8_ = fVar41;
                      local_2e8._8_8_ = local_2e8._8_8_ + 4;
                    }
                    lVar31 = lVar31 + 1;
                  } while (lVar31 < (this->super_ConvolutionDepthWise).group);
                }
                std::vector<float,_std::allocator<float>_>::vector
                          (&local_d8,(vector<float,_std::allocator<float>_> *)local_2e8);
                convdw3x3s2_int8_dequant_sse
                          (&local_278,top_blob,&this->weight_data_tm,
                           &(this->super_ConvolutionDepthWise).bias_data,&local_d8,opt_00);
                goto joined_r0x0042c4b6;
              }
              local_2e8._0_8_ = (pointer)0x0;
              local_2e8._8_8_ = (Allocator *)0x0;
              local_2e8._16_4_ = 0;
              local_2e8._20_4_ = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar31 = 0;
                local_2e8._8_8_ = (float *)0x0;
                do {
                  fVar41 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                            weight_data_int8_scales.data + lVar31 * 4);
                  fVar52 = 0.0;
                  if (fVar41 != 0.0) {
                    fVar52 = 1.0 / (fVar41 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                              bottom_blob_int8_scales.data +
                                                       lVar31 * 4));
                  }
                  local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar52);
                  local_178 = (pointer)CONCAT44(local_178._4_4_,
                                                *(undefined4 *)
                                                 ((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar31 * 4));
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_228);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = fVar52;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_178);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = local_178._0_4_;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  lVar31 = lVar31 + 1;
                } while (lVar31 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_c0,(vector<float,_std::allocator<float>_> *)local_2e8);
              convdw3x3s2_int8_requant_sse
                        (&local_278,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_c0,opt_00);
              goto joined_r0x0042be57;
            }
            local_320 = 0;
            uVar44 = uVar44 * iVar48;
            local_e0 = (size_type)(int)uVar44;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_2e8,local_e0,
                       (allocator_type *)&local_228);
            uVar24 = local_2e8._0_8_;
            if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
              iVar48 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar40 = (this->super_ConvolutionDepthWise).dilation_w;
              iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar30 = 0;
              fVar41 = 0.0;
              iVar35 = 0;
              do {
                if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                  lVar31 = 0;
                  do {
                    *(float *)(local_2e8._0_8_ + (iVar35 + lVar31) * 4) = fVar41;
                    fVar41 = (float)((int)fVar41 + (this->super_ConvolutionDepthWise).dilation_w);
                    lVar31 = lVar31 + 1;
                  } while ((int)lVar31 < (this->super_ConvolutionDepthWise).kernel_w);
                  iVar35 = iVar35 + (int)lVar31;
                }
                fVar41 = (float)((int)fVar41 + ((int)local_280 * iVar48 - iVar40 * iVar50));
                iVar30 = iVar30 + 1;
              } while (iVar30 < (this->super_ConvolutionDepthWise).kernel_h);
            }
            if (0 < (this->super_ConvolutionDepthWise).group) {
              local_280 = 0;
              auVar60 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              uVar36 = 0;
              do {
                pvVar2 = local_278.data;
                lVar31 = local_280;
                if (-1 < (int)local_1d0) {
                  lVar43 = local_278.cstep * uVar36 * local_278.elemsize;
                  pfVar49 = (float *)(top_blob->elemsize * uVar36 * top_blob->cstep +
                                     (long)top_blob->data);
                  local_288 = (long)local_278.w * local_278.elemsize;
                  pvVar3 = (this->weight_data_tm).data;
                  local_1d8 = 0;
                  local_298 = pfVar49;
                  local_290 = uVar36;
                  do {
                    if (-1 < iVar38) {
                      lVar32 = (long)(int)local_1d8;
                      iVar48 = 0;
                      do {
                        fVar41 = 0.0;
                        fVar52 = 0.0;
                        if (0 < (int)uVar44) {
                          uVar34 = 0;
                          iVar40 = 0;
                          do {
                            iVar40 = iVar40 + (int)*(char *)((long)pvVar3 + uVar34 + lVar31) *
                                              (int)*(char *)((long)pvVar2 +
                                                            (long)(int)*(pointer)(uVar24 + uVar34 * 
                                                  4) + (this->super_ConvolutionDepthWise).stride_h *
                                                       lVar32 * local_288 +
                                                       (long)iVar48 *
                                                       (long)(this->super_ConvolutionDepthWise).
                                                             stride_w + lVar43);
                            uVar34 = uVar34 + 1;
                          } while (uVar44 != uVar34);
                          fVar52 = (float)iVar40;
                        }
                        fVar96 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                                  weight_data_int8_scales.data + uVar36 * 4);
                        if (fVar96 != 0.0) {
                          fVar41 = 1.0 / (fVar96 * *(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + uVar36 * 4));
                        }
                        fVar41 = fVar41 * fVar52;
                        if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                          fVar41 = fVar41 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                             bias_data.data + uVar36 * 4);
                        }
                        auVar102 = ZEXT416((uint)fVar41);
                        fVar52 = fVar41;
                        switch((this->super_ConvolutionDepthWise).activation_type) {
                        case 1:
                          auVar102 = vmaxss_avx(auVar102,ZEXT416(0));
                          fVar52 = auVar102._0_4_;
                          break;
                        case 2:
                          auVar102 = vcmpss_avx(ZEXT816(0) << 0x20,auVar102,1);
                          auVar58._8_4_ = 0x3f800000;
                          auVar58._0_8_ = 0x3f8000003f800000;
                          auVar58._12_4_ = 0x3f800000;
                          auVar102 = vblendvps_avx(ZEXT416(*(this->super_ConvolutionDepthWise).
                                                            activation_params.data),auVar58,auVar102
                                                  );
                          fVar97 = auVar102._0_4_;
LAB_0042c2a2:
                          fVar52 = fVar97 * fVar41;
                          break;
                        case 3:
                          puVar5 = (uint *)(this->super_ConvolutionDepthWise).activation_params.data
                          ;
                          fVar41 = (float)puVar5[1];
                          auVar102 = vmaxss_avx(auVar102,ZEXT416(*puVar5));
                          fVar52 = auVar102._0_4_;
                          if (fVar41 < auVar102._0_4_) {
                            fVar52 = fVar41;
                          }
                          break;
                        case 4:
                          auVar102 = vminss_avx(auVar102,ZEXT416(0x42b0c0a5));
                          auVar53._0_4_ = auVar102._0_4_ ^ auVar60._0_4_;
                          auVar53._4_4_ = auVar102._4_4_ ^ auVar60._4_4_;
                          auVar53._8_4_ = auVar102._8_4_ ^ auVar60._8_4_;
                          auVar53._12_4_ = auVar102._12_4_ ^ auVar60._12_4_;
                          auVar102 = vcmpss_avx(auVar102,ZEXT416(0xc2b0c0a5),1);
                          auVar57._8_4_ = 0x42b0c0a5;
                          auVar57._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar57._12_4_ = 0x42b0c0a5;
                          auVar102 = vblendvps_avx(auVar53,auVar57,auVar102);
                          fVar41 = expf(auVar102._0_4_);
                          auVar60 = ZEXT1664(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000)));
                          uVar36 = local_290;
                          fVar52 = 1.0 / (fVar41 + 1.0);
                          break;
                        case 5:
                          fVar52 = expf(fVar41);
                          fVar52 = logf(fVar52 + 1.0);
                          fVar52 = tanhf(fVar52);
                          auVar60 = ZEXT1664(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000)));
                          uVar36 = local_290;
                          fVar52 = fVar52 * fVar41;
                          break;
                        case 6:
                          pfVar6 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                            data;
                          fVar96 = *pfVar6;
                          fVar97 = pfVar6[1];
                          fVar61 = (float)((uint)fVar97 ^ auVar60._0_4_) / fVar96;
                          fVar52 = 0.0;
                          if ((fVar61 <= fVar41) &&
                             (fVar52 = fVar41, fVar41 <= fVar61 + 1.0 / fVar96)) {
                            fVar97 = fVar96 * fVar41 + fVar97;
                            goto LAB_0042c2a2;
                          }
                        }
                        if (iVar29 < 0x65) {
                          *pfVar49 = fVar52;
                          pfVar49 = pfVar49 + 1;
                        }
                        else {
                          fVar52 = fVar52 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                             top_blob_int8_scales.data + uVar36 * 4)
                          ;
                          auVar102 = vandps_avx(ZEXT416((uint)fVar52),auVar60._0_16_);
                          auVar59._8_4_ = 0x3effffff;
                          auVar59._0_8_ = 0x3effffff3effffff;
                          auVar59._12_4_ = 0x3effffff;
                          auVar102 = vorps_avx(auVar102,auVar59);
                          auVar102 = ZEXT416((uint)(fVar52 + auVar102._0_4_));
                          auVar102 = vroundss_avx(auVar102,auVar102,0xb);
                          iVar40 = (int)auVar102._0_4_;
                          if (iVar40 < -0x7e) {
                            iVar40 = -0x7f;
                          }
                          uVar27 = (undefined1)iVar40;
                          if (0x7e < iVar40) {
                            uVar27 = 0x7f;
                          }
                          *(undefined1 *)local_298 = uVar27;
                          local_298 = (float *)((long)local_298 + 1);
                        }
                        bVar51 = iVar48 != iVar38;
                        iVar48 = iVar48 + 1;
                      } while (bVar51);
                    }
                    iVar48 = (int)local_1d8;
                    local_1d8 = (ulong)(iVar48 + 1);
                  } while (iVar48 != (int)local_1d0);
                }
                uVar36 = uVar36 + 1;
                local_280 = local_280 + local_e0;
              } while ((long)uVar36 < (long)(this->super_ConvolutionDepthWise).group);
            }
            if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2e8._0_8_,
                              CONCAT44(local_2e8._20_4_,local_2e8._16_4_) - local_2e8._0_8_);
            }
            local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
          }
          else {
            if (iVar29 < 0x65) {
              local_2e8._0_8_ = (pointer)0x0;
              local_2e8._8_8_ = (Allocator *)0x0;
              local_2e8._16_4_ = 0;
              local_2e8._20_4_ = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar31 = 0;
                local_2e8._8_8_ = (float *)0x0;
                do {
                  fVar41 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar31 * 4) *
                                 *(float *)((long)(this->super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar31 * 4));
                  local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar41);
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_228);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = fVar41;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  lVar31 = lVar31 + 1;
                } while (lVar31 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_a8,(vector<float,_std::allocator<float>_> *)local_2e8);
              convdw3x3s1_int8_dequant_sse
                        (&local_278,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_a8,opt_00);
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
joined_r0x0042c4b6:
              if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              local_2e8._0_8_ = (pointer)0x0;
              local_2e8._8_8_ = (Allocator *)0x0;
              local_2e8._16_4_ = 0;
              local_2e8._20_4_ = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar31 = 0;
                local_2e8._8_8_ = (float *)0x0;
                do {
                  fVar41 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                            weight_data_int8_scales.data + lVar31 * 4);
                  fVar52 = 0.0;
                  if (fVar41 != 0.0) {
                    fVar52 = 1.0 / (fVar41 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                              bottom_blob_int8_scales.data +
                                                       lVar31 * 4));
                  }
                  local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar52);
                  local_178 = (pointer)CONCAT44(local_178._4_4_,
                                                *(undefined4 *)
                                                 ((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar31 * 4));
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_228);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = fVar52;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  if ((float *)local_2e8._8_8_ ==
                      (float *)CONCAT44(local_2e8._20_4_,local_2e8._16_4_)) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2e8,
                               (iterator)local_2e8._8_8_,(float *)&local_178);
                  }
                  else {
                    *(float *)local_2e8._8_8_ = local_178._0_4_;
                    local_2e8._8_8_ = local_2e8._8_8_ + 4;
                  }
                  lVar31 = lVar31 + 1;
                } while (lVar31 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_90,(vector<float,_std::allocator<float>_> *)local_2e8);
              convdw3x3s1_int8_requant_sse
                        (&local_278,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_90,opt_00);
              local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
joined_r0x0042be57:
              if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_c0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            local_320 = 0;
            if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2e8._0_8_,
                              CONCAT44(local_2e8._20_4_,local_2e8._16_4_) - local_2e8._0_8_);
            }
            pLVar7 = this->activation;
            if (pLVar7 != (Layer *)0x0) {
              (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
            }
          }
        }
        else {
          if (iVar50 == 8) {
            uVar36 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                     (long)(this->super_ConvolutionDepthWise).kernel_w;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_2e8,uVar36,
                       (allocator_type *)&local_228);
            if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
              iVar48 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar40 = (this->super_ConvolutionDepthWise).dilation_w;
              iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar35 = 0;
              fVar41 = 0.0;
              iVar45 = 0;
              do {
                if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                  lVar31 = 0;
                  do {
                    *(float *)(local_2e8._0_8_ + (iVar35 + lVar31) * 4) = fVar41;
                    fVar41 = (float)((int)fVar41 + (this->super_ConvolutionDepthWise).dilation_w);
                    lVar31 = lVar31 + 1;
                  } while ((int)lVar31 < (this->super_ConvolutionDepthWise).kernel_w);
                  iVar35 = iVar35 + (int)lVar31;
                }
                fVar41 = (float)((int)fVar41 + (iVar48 * (int)local_280 - iVar40 * iVar50));
                iVar45 = iVar45 + 1;
              } while (iVar45 < (this->super_ConvolutionDepthWise).kernel_h);
            }
            if (0 < iVar30) {
              local_290 = 0;
              auVar141 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              auVar60 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
              auVar138 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
              auVar133._8_4_ = 0x3f800000;
              auVar133._0_8_ = 0x3f8000003f800000;
              auVar133._12_4_ = 0x3f800000;
              local_308 = 0;
              do {
                if (-1 < (int)local_1d0) {
                  local_298 = (float *)(local_278.cstep * local_308 * local_278.elemsize +
                                       (long)local_278.data);
                  pauVar46 = (undefined1 (*) [16])
                             (top_blob->elemsize * local_308 * top_blob->cstep +
                             (long)top_blob->data);
                  pvVar2 = (this->weight_data_tm).data;
                  uVar39 = 0;
                  pauVar47 = pauVar46;
                  do {
                    local_288 = uVar39;
                    iVar48 = (int)local_288;
                    if (-1 < iVar38) {
                      iVar40 = 0;
                      do {
                        if ((int)uVar36 < 1) {
                          auVar103 = ZEXT816(0) << 0x40;
                          auVar102 = ZEXT816(0) << 0x40;
                        }
                        else {
                          auVar67 = ZEXT1664((undefined1  [16])0x0);
                          uVar39 = 0;
                          auVar76 = ZEXT1664((undefined1  [16])0x0);
                          do {
                            auVar77._8_8_ = 0;
                            auVar77._0_8_ =
                                 *(ulong *)((long)local_298 +
                                           (long)(int)*(pointer)(local_2e8._0_8_ + uVar39 * 4) * 8 +
                                           (long)(this->super_ConvolutionDepthWise).stride_h *
                                           (long)iVar48 * (long)local_278.w * local_278.elemsize +
                                           (long)((this->super_ConvolutionDepthWise).stride_w *
                                                  iVar40 * 8));
                            auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar77);
                            auVar103 = vpunpcklbw_avx(auVar77,auVar102);
                            auVar98._8_8_ = 0;
                            auVar98._0_8_ =
                                 *(ulong *)((long)pvVar2 + uVar39 * 8 + (long)(int)local_290);
                            auVar102 = vpcmpgtb_avx((undefined1  [16])0x0,auVar98);
                            auVar102 = vpunpcklbw_avx(auVar98,auVar102);
                            auVar56 = vpmullw_avx(auVar102,auVar103);
                            auVar103 = vpmulhw_avx(auVar103,auVar102);
                            auVar102 = vpunpcklwd_avx(auVar56,auVar103);
                            auVar102 = vpaddd_avx(auVar67._0_16_,auVar102);
                            auVar67 = ZEXT1664(auVar102);
                            auVar103 = vpunpckhwd_avx(auVar56,auVar103);
                            auVar103 = vpaddd_avx(auVar76._0_16_,auVar103);
                            auVar76 = ZEXT1664(auVar103);
                            uVar39 = uVar39 + 1;
                          } while ((uVar36 & 0xffffffff) != uVar39);
                          auVar102 = vcvtdq2ps_avx(auVar102);
                          auVar103 = vcvtdq2ps_avx(auVar103);
                        }
                        pvVar3 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                        pvVar4 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                        auVar56 = *(undefined1 (*) [16])((long)pvVar3 + local_308 * 0x20);
                        auVar53 = *(undefined1 (*) [16])((long)pvVar3 + local_308 * 0x20 + 0x10);
                        pfVar49 = (float *)((long)pvVar4 + local_308 * 0x20);
                        auVar99._0_4_ = auVar56._0_4_ * *pfVar49;
                        auVar99._4_4_ = auVar56._4_4_ * pfVar49[1];
                        auVar99._8_4_ = auVar56._8_4_ * pfVar49[2];
                        auVar99._12_4_ = auVar56._12_4_ * pfVar49[3];
                        auVar57 = vrcpps_avx(auVar99);
                        pfVar49 = (float *)((long)pvVar4 + local_308 * 0x20 + 0x10);
                        auVar116._0_4_ = auVar53._0_4_ * *pfVar49;
                        auVar116._4_4_ = auVar53._4_4_ * pfVar49[1];
                        auVar116._8_4_ = auVar53._8_4_ * pfVar49[2];
                        auVar116._12_4_ = auVar53._12_4_ * pfVar49[3];
                        auVar58 = vrcpps_avx(auVar116);
                        auVar56 = vcmpps_avx(auVar56,(undefined1  [16])0x0,4);
                        auVar56 = vandps_avx(auVar56,auVar57);
                        auVar62._0_4_ = auVar56._0_4_ * auVar102._0_4_;
                        auVar62._4_4_ = auVar56._4_4_ * auVar102._4_4_;
                        auVar62._8_4_ = auVar56._8_4_ * auVar102._8_4_;
                        auVar62._12_4_ = auVar56._12_4_ * auVar102._12_4_;
                        auVar102 = vcmpps_avx(auVar53,(undefined1  [16])0x0,4);
                        auVar102 = vandps_avx(auVar102,auVar58);
                        auVar71._0_4_ = auVar102._0_4_ * auVar103._0_4_;
                        auVar71._4_4_ = auVar102._4_4_ * auVar103._4_4_;
                        auVar71._8_4_ = auVar102._8_4_ * auVar103._8_4_;
                        auVar71._12_4_ = auVar102._12_4_ * auVar103._12_4_;
                        if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                          pvVar3 = (this->super_ConvolutionDepthWise).bias_data.data;
                          pfVar49 = (float *)((long)pvVar3 + local_308 * 0x20);
                          auVar62._0_4_ = auVar62._0_4_ + *pfVar49;
                          auVar62._4_4_ = auVar62._4_4_ + pfVar49[1];
                          auVar62._8_4_ = auVar62._8_4_ + pfVar49[2];
                          auVar62._12_4_ = auVar62._12_4_ + pfVar49[3];
                          pfVar49 = (float *)((long)pvVar3 + local_308 * 0x20 + 0x10);
                          auVar71._0_4_ = auVar71._0_4_ + *pfVar49;
                          auVar71._4_4_ = auVar71._4_4_ + pfVar49[1];
                          auVar71._8_4_ = auVar71._8_4_ + pfVar49[2];
                          auVar71._12_4_ = auVar71._12_4_ + pfVar49[3];
                        }
                        iVar50 = (this->super_ConvolutionDepthWise).activation_type + -1;
                        fVar41 = auVar60._0_4_;
                        fVar52 = auVar60._4_4_;
                        fVar96 = auVar60._8_4_;
                        fVar97 = auVar60._12_4_;
                        fVar61 = auVar62._0_4_;
                        fVar68 = auVar62._4_4_;
                        fVar69 = auVar62._8_4_;
                        fVar70 = auVar62._12_4_;
                        switch(iVar50) {
                        case 0:
                          auVar62 = vmaxps_avx(auVar62,(undefined1  [16])0x0);
                          break;
                        case 1:
                          auVar102 = vmaxps_avx(auVar62,(undefined1  [16])0x0);
                          auVar103 = vminps_avx(auVar62,(undefined1  [16])0x0);
                          fVar41 = *(this->super_ConvolutionDepthWise).activation_params.data;
                          auVar62._0_4_ = fVar41 * auVar103._0_4_ + auVar102._0_4_;
                          auVar62._4_4_ = fVar41 * auVar103._4_4_ + auVar102._4_4_;
                          auVar62._8_4_ = fVar41 * auVar103._8_4_ + auVar102._8_4_;
                          auVar62._12_4_ = fVar41 * auVar103._12_4_ + auVar102._12_4_;
                          break;
                        case 2:
                          puVar33 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar42 = *puVar33;
                          auVar82._4_4_ = uVar42;
                          auVar82._0_4_ = uVar42;
                          auVar82._8_4_ = uVar42;
                          auVar82._12_4_ = uVar42;
                          uVar42 = puVar33[1];
                          auVar107._4_4_ = uVar42;
                          auVar107._0_4_ = uVar42;
                          auVar107._8_4_ = uVar42;
                          auVar107._12_4_ = uVar42;
                          auVar102 = vmaxps_avx(auVar62,auVar82);
                          auVar62 = vminps_avx(auVar102,auVar107);
                          break;
                        case 3:
                          auVar63._0_4_ = auVar141._0_4_ ^ (uint)fVar61;
                          auVar63._4_4_ = auVar141._4_4_ ^ (uint)fVar68;
                          auVar63._8_4_ = auVar141._8_4_ ^ (uint)fVar69;
                          auVar63._12_4_ = auVar141._12_4_ ^ (uint)fVar70;
                          auVar102 = vminps_avx(auVar138._0_16_,auVar63);
                          auVar83._8_4_ = 0xc2b0c0a5;
                          auVar83._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar83._12_4_ = 0xc2b0c0a5;
                          auVar56 = vmaxps_avx(auVar102,auVar83);
                          auVar84._0_4_ = auVar56._0_4_ * 1.442695 + fVar41;
                          auVar84._4_4_ = auVar56._4_4_ * 1.442695 + fVar52;
                          auVar84._8_4_ = auVar56._8_4_ * 1.442695 + fVar96;
                          auVar84._12_4_ = auVar56._12_4_ * 1.442695 + fVar97;
                          auVar108._0_4_ = (int)auVar84._0_4_;
                          auVar108._4_4_ = (int)auVar84._4_4_;
                          auVar108._8_4_ = (int)auVar84._8_4_;
                          auVar108._12_4_ = (int)auVar84._12_4_;
                          auVar103 = vcvtdq2ps_avx(auVar108);
                          auVar102 = vcmpps_avx(auVar84,auVar103,1);
                          auVar102 = vandps_avx(auVar133,auVar102);
                          auVar102 = vsubps_avx(auVar103,auVar102);
                          fVar61 = auVar56._0_4_ + auVar102._0_4_ * -0.6931472;
                          fVar68 = auVar56._4_4_ + auVar102._4_4_ * -0.6931472;
                          fVar69 = auVar56._8_4_ + auVar102._8_4_ * -0.6931472;
                          fVar70 = auVar56._12_4_ + auVar102._12_4_ * -0.6931472;
                          auVar85._0_4_ = (int)auVar102._0_4_;
                          auVar85._4_4_ = (int)auVar102._4_4_;
                          auVar85._8_4_ = (int)auVar102._8_4_;
                          auVar85._12_4_ = (int)auVar102._12_4_;
                          auVar102 = vpslld_avx(auVar85,0x17);
                          auVar102 = vpaddd_avx(auVar133,auVar102);
                          auVar64._0_4_ =
                               (fVar61 + 1.0 +
                               fVar61 * fVar61 *
                               (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) *
                                  fVar61 + 0.041665796) * fVar61 + 0.16666666) * fVar61 + fVar41)) *
                               auVar102._0_4_ + 1.0;
                          auVar64._4_4_ =
                               (fVar68 + 1.0 +
                               fVar68 * fVar68 *
                               (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) *
                                  fVar68 + 0.041665796) * fVar68 + 0.16666666) * fVar68 + fVar52)) *
                               auVar102._4_4_ + 1.0;
                          auVar64._8_4_ =
                               (fVar69 + 1.0 +
                               fVar69 * fVar69 *
                               (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) *
                                  fVar69 + 0.041665796) * fVar69 + 0.16666666) * fVar69 + fVar96)) *
                               auVar102._8_4_ + 1.0;
                          auVar64._12_4_ =
                               (fVar70 + 1.0 +
                               fVar70 * fVar70 *
                               (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) *
                                  fVar70 + 0.041665796) * fVar70 + 0.16666666) * fVar70 + fVar97)) *
                               auVar102._12_4_ + 1.0;
                          auVar62 = vdivps_avx(auVar133,auVar64);
                          break;
                        case 4:
                          auVar102 = vminps_avx(auVar138._0_16_,auVar62);
                          auVar139._8_4_ = 0xc2b0c0a5;
                          auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar139._12_4_ = 0xc2b0c0a5;
                          auVar56 = vmaxps_avx(auVar139,auVar102);
                          auVar100._0_4_ = auVar56._0_4_ * 1.442695 + fVar41;
                          auVar100._4_4_ = auVar56._4_4_ * 1.442695 + fVar52;
                          auVar100._8_4_ = auVar56._8_4_ * 1.442695 + fVar96;
                          auVar100._12_4_ = auVar56._12_4_ * 1.442695 + fVar97;
                          auVar117._0_4_ = (int)auVar100._0_4_;
                          auVar117._4_4_ = (int)auVar100._4_4_;
                          auVar117._8_4_ = (int)auVar100._8_4_;
                          auVar117._12_4_ = (int)auVar100._12_4_;
                          auVar103 = vcvtdq2ps_avx(auVar117);
                          auVar102 = vcmpps_avx(auVar100,auVar103,1);
                          auVar102 = vandps_avx(auVar133,auVar102);
                          auVar102 = vsubps_avx(auVar103,auVar102);
                          auVar118._0_4_ = auVar102._0_4_ * 0.6931472;
                          auVar118._4_4_ = auVar102._4_4_ * 0.6931472;
                          auVar118._8_4_ = auVar102._8_4_ * 0.6931472;
                          auVar118._12_4_ = auVar102._12_4_ * 0.6931472;
                          auVar103 = vsubps_avx(auVar56,auVar118);
                          fVar41 = auVar103._0_4_;
                          fVar52 = auVar103._4_4_;
                          fVar96 = auVar103._8_4_;
                          fVar97 = auVar103._12_4_;
                          auVar101._0_4_ = (int)auVar102._0_4_;
                          auVar101._4_4_ = (int)auVar102._4_4_;
                          auVar101._8_4_ = (int)auVar102._8_4_;
                          auVar101._12_4_ = (int)auVar102._12_4_;
                          auVar102 = vpslld_avx(auVar101,0x17);
                          auVar102 = vpaddd_avx(auVar133,auVar102);
                          auVar134._0_4_ =
                               (fVar41 + 1.0 +
                               (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) *
                                  fVar41 + 0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5) *
                               fVar41 * fVar41) * auVar102._0_4_ + 1.0;
                          auVar134._4_4_ =
                               (fVar52 + 1.0 +
                               (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                                  fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                               fVar52 * fVar52) * auVar102._4_4_ + 1.0;
                          auVar134._8_4_ =
                               (fVar96 + 1.0 +
                               (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) *
                                  fVar96 + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) *
                               fVar96 * fVar96) * auVar102._8_4_ + 1.0;
                          auVar134._12_4_ =
                               (fVar97 + 1.0 +
                               (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) *
                                  fVar97 + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) *
                               fVar97 * fVar97) * auVar102._12_4_ + 1.0;
                          auVar78._8_4_ = 0x800000;
                          auVar78._0_8_ = 0x80000000800000;
                          auVar78._12_4_ = 0x800000;
                          auVar102 = vmaxps_avx(auVar134,auVar78);
                          auVar103 = vpsrld_avx(auVar102,0x17);
                          auVar119._8_4_ = 0x807fffff;
                          auVar119._0_8_ = 0x807fffff807fffff;
                          auVar119._12_4_ = 0x807fffff;
                          auVar102 = vandps_avx(auVar102,auVar119);
                          auVar120._8_4_ = 0x3f000000;
                          auVar120._0_8_ = 0x3f0000003f000000;
                          auVar120._12_4_ = 0x3f000000;
                          auVar53 = vorps_avx(auVar102,auVar120);
                          auVar121._8_4_ = 0xffffff82;
                          auVar121._0_8_ = 0xffffff82ffffff82;
                          auVar121._12_4_ = 0xffffff82;
                          auVar102 = vpaddd_avx(auVar103,auVar121);
                          auVar56 = vcvtdq2ps_avx(auVar102);
                          auVar122._8_4_ = 0x3f3504f3;
                          auVar122._0_8_ = 0x3f3504f33f3504f3;
                          auVar122._12_4_ = 0x3f3504f3;
                          auVar103 = vcmpps_avx(auVar53,auVar122,1);
                          auVar102 = vandps_avx(auVar103,auVar53);
                          fVar41 = auVar102._0_4_ + auVar53._0_4_ + -1.0;
                          fVar52 = auVar102._4_4_ + auVar53._4_4_ + -1.0;
                          fVar96 = auVar102._8_4_ + auVar53._8_4_ + -1.0;
                          fVar97 = auVar102._12_4_ + auVar53._12_4_ + -1.0;
                          auVar102 = vandps_avx(auVar133,auVar103);
                          auVar103 = vsubps_avx(auVar56,auVar102);
                          auVar136._8_4_ = 0x42b0c0a5;
                          auVar136._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar136._12_4_ = 0x42b0c0a5;
                          auVar138 = ZEXT1664(auVar136);
                          auVar102 = vcmpps_avx(auVar134,(undefined1  [16])0x0,2);
                          auVar79._0_4_ =
                               (auVar103._0_4_ * 0.6931472 + fVar41 +
                               (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) *
                                      fVar41 + -0.12420141) * fVar41 + 0.14249323) * fVar41 +
                                   -0.16668057) * fVar41 + 0.20000714) * fVar41 + -0.24999994) *
                                 fVar41 + 0.3333333) * fVar41 + -0.5) * fVar41 * fVar41) * -2.0;
                          auVar79._4_4_ =
                               (auVar103._4_4_ * 0.6931472 + fVar52 +
                               (((((((((fVar52 * 0.070376836 + -0.1151461) * fVar52 + 0.116769984) *
                                      fVar52 + -0.12420141) * fVar52 + 0.14249323) * fVar52 +
                                   -0.16668057) * fVar52 + 0.20000714) * fVar52 + -0.24999994) *
                                 fVar52 + 0.3333333) * fVar52 + -0.5) * fVar52 * fVar52) * -2.0;
                          auVar79._8_4_ =
                               (auVar103._8_4_ * 0.6931472 + fVar96 +
                               (((((((((fVar96 * 0.070376836 + -0.1151461) * fVar96 + 0.116769984) *
                                      fVar96 + -0.12420141) * fVar96 + 0.14249323) * fVar96 +
                                   -0.16668057) * fVar96 + 0.20000714) * fVar96 + -0.24999994) *
                                 fVar96 + 0.3333333) * fVar96 + -0.5) * fVar96 * fVar96) * -2.0;
                          auVar79._12_4_ =
                               (auVar103._12_4_ * 0.6931472 + fVar97 +
                               (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 + 0.116769984) *
                                      fVar97 + -0.12420141) * fVar97 + 0.14249323) * fVar97 +
                                   -0.16668057) * fVar97 + 0.20000714) * fVar97 + -0.24999994) *
                                 fVar97 + 0.3333333) * fVar97 + -0.5) * fVar97 * fVar97) * -2.0;
                          auVar54._8_4_ = 0x7fffffff;
                          auVar54._0_8_ = 0x7fffffff7fffffff;
                          auVar54._12_4_ = 0x7fffffff;
                          auVar102 = vblendvps_avx(auVar79,auVar54,auVar102);
                          auVar102 = vminps_avx(auVar136,auVar102);
                          auVar56 = vmaxps_avx(auVar139,auVar102);
                          auVar141 = ZEXT1664(CONCAT412(0x80000000,
                                                        CONCAT48(0x80000000,0x8000000080000000)));
                          auVar104._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
                          auVar104._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
                          auVar104._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
                          auVar104._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
                          auVar123._0_4_ = (int)auVar104._0_4_;
                          auVar123._4_4_ = (int)auVar104._4_4_;
                          auVar123._8_4_ = (int)auVar104._8_4_;
                          auVar123._12_4_ = (int)auVar104._12_4_;
                          auVar103 = vcvtdq2ps_avx(auVar123);
                          auVar102 = vcmpps_avx(auVar104,auVar103,1);
                          auVar102 = vandps_avx(auVar133,auVar102);
                          auVar102 = vsubps_avx(auVar103,auVar102);
                          auVar124._0_4_ = auVar102._0_4_ * 0.6931472;
                          auVar124._4_4_ = auVar102._4_4_ * 0.6931472;
                          auVar124._8_4_ = auVar102._8_4_ * 0.6931472;
                          auVar124._12_4_ = auVar102._12_4_ * 0.6931472;
                          auVar103 = vsubps_avx(auVar56,auVar124);
                          fVar41 = auVar103._0_4_;
                          fVar52 = auVar103._4_4_;
                          fVar96 = auVar103._8_4_;
                          fVar97 = auVar103._12_4_;
                          auVar60 = ZEXT1664(CONCAT412(0x3f000000,
                                                       CONCAT48(0x3f000000,0x3f0000003f000000)));
                          auVar105._0_4_ = (int)auVar102._0_4_;
                          auVar105._4_4_ = (int)auVar102._4_4_;
                          auVar105._8_4_ = (int)auVar102._8_4_;
                          auVar105._12_4_ = (int)auVar102._12_4_;
                          auVar102 = vpslld_avx(auVar105,0x17);
                          auVar102 = vpaddd_avx(auVar133,auVar102);
                          auVar80._0_4_ =
                               (fVar41 + 1.0 +
                               (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) *
                                  fVar41 + 0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5) *
                               fVar41 * fVar41) * auVar102._0_4_ + 1.0;
                          auVar80._4_4_ =
                               (fVar52 + 1.0 +
                               (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                                  fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                               fVar52 * fVar52) * auVar102._4_4_ + 1.0;
                          auVar80._8_4_ =
                               (fVar96 + 1.0 +
                               (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) *
                                  fVar96 + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) *
                               fVar96 * fVar96) * auVar102._8_4_ + 1.0;
                          auVar80._12_4_ =
                               (fVar97 + 1.0 +
                               (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) *
                                  fVar97 + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) *
                               fVar97 * fVar97) * auVar102._12_4_ + 1.0;
                          auVar106._8_4_ = 0x40000000;
                          auVar106._0_8_ = 0x4000000040000000;
                          auVar106._12_4_ = 0x40000000;
                          auVar102 = vdivps_avx(auVar106,auVar80);
                          auVar81._0_4_ = auVar102._0_4_ + -1.0;
                          auVar81._4_4_ = auVar102._4_4_ + -1.0;
                          auVar81._8_4_ = auVar102._8_4_ + -1.0;
                          auVar81._12_4_ = auVar102._12_4_ + -1.0;
                          goto LAB_0042adee;
                        case 5:
                          pfVar49 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                             data;
                          fVar41 = *pfVar49;
                          fVar52 = pfVar49[1];
                          auVar86._0_4_ = fVar41 * fVar61 + fVar52;
                          auVar86._4_4_ = fVar41 * fVar68 + fVar52;
                          auVar86._8_4_ = fVar41 * fVar69 + fVar52;
                          auVar86._12_4_ = fVar41 * fVar70 + fVar52;
                          auVar102 = vmaxps_avx(auVar86,(undefined1  [16])0x0);
                          auVar81 = vminps_avx(auVar133,auVar102);
LAB_0042adee:
                          auVar62._0_4_ = auVar81._0_4_ * fVar61;
                          auVar62._4_4_ = auVar81._4_4_ * fVar68;
                          auVar62._8_4_ = auVar81._8_4_ * fVar69;
                          auVar62._12_4_ = auVar81._12_4_ * fVar70;
                        }
                        fVar41 = auVar60._0_4_;
                        fVar52 = auVar60._4_4_;
                        fVar96 = auVar60._8_4_;
                        fVar97 = auVar60._12_4_;
                        fVar61 = auVar71._0_4_;
                        fVar68 = auVar71._4_4_;
                        fVar69 = auVar71._8_4_;
                        fVar70 = auVar71._12_4_;
                        switch(iVar50) {
                        case 0:
                          auVar71 = vmaxps_avx(auVar71,(undefined1  [16])0x0);
                          break;
                        case 1:
                          auVar102 = vmaxps_avx(auVar71,(undefined1  [16])0x0);
                          auVar103 = vminps_avx(auVar71,(undefined1  [16])0x0);
                          fVar41 = *(this->super_ConvolutionDepthWise).activation_params.data;
                          auVar71._0_4_ = fVar41 * auVar103._0_4_ + auVar102._0_4_;
                          auVar71._4_4_ = fVar41 * auVar103._4_4_ + auVar102._4_4_;
                          auVar71._8_4_ = fVar41 * auVar103._8_4_ + auVar102._8_4_;
                          auVar71._12_4_ = fVar41 * auVar103._12_4_ + auVar102._12_4_;
                          break;
                        case 2:
                          puVar33 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar42 = *puVar33;
                          auVar91._4_4_ = uVar42;
                          auVar91._0_4_ = uVar42;
                          auVar91._8_4_ = uVar42;
                          auVar91._12_4_ = uVar42;
                          uVar42 = puVar33[1];
                          auVar114._4_4_ = uVar42;
                          auVar114._0_4_ = uVar42;
                          auVar114._8_4_ = uVar42;
                          auVar114._12_4_ = uVar42;
                          auVar102 = vmaxps_avx(auVar71,auVar91);
                          auVar71 = vminps_avx(auVar102,auVar114);
                          break;
                        case 3:
                          auVar72._0_4_ = auVar141._0_4_ ^ (uint)fVar61;
                          auVar72._4_4_ = auVar141._4_4_ ^ (uint)fVar68;
                          auVar72._8_4_ = auVar141._8_4_ ^ (uint)fVar69;
                          auVar72._12_4_ = auVar141._12_4_ ^ (uint)fVar70;
                          auVar102 = vminps_avx(auVar138._0_16_,auVar72);
                          auVar92._8_4_ = 0xc2b0c0a5;
                          auVar92._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar92._12_4_ = 0xc2b0c0a5;
                          auVar56 = vmaxps_avx(auVar102,auVar92);
                          auVar93._0_4_ = auVar56._0_4_ * 1.442695 + fVar41;
                          auVar93._4_4_ = auVar56._4_4_ * 1.442695 + fVar52;
                          auVar93._8_4_ = auVar56._8_4_ * 1.442695 + fVar96;
                          auVar93._12_4_ = auVar56._12_4_ * 1.442695 + fVar97;
                          auVar115._0_4_ = (int)auVar93._0_4_;
                          auVar115._4_4_ = (int)auVar93._4_4_;
                          auVar115._8_4_ = (int)auVar93._8_4_;
                          auVar115._12_4_ = (int)auVar93._12_4_;
                          auVar103 = vcvtdq2ps_avx(auVar115);
                          auVar102 = vcmpps_avx(auVar93,auVar103,1);
                          auVar102 = vandps_avx(auVar133,auVar102);
                          auVar102 = vsubps_avx(auVar103,auVar102);
                          fVar61 = auVar56._0_4_ + auVar102._0_4_ * -0.6931472;
                          fVar68 = auVar56._4_4_ + auVar102._4_4_ * -0.6931472;
                          fVar69 = auVar56._8_4_ + auVar102._8_4_ * -0.6931472;
                          fVar70 = auVar56._12_4_ + auVar102._12_4_ * -0.6931472;
                          auVar94._0_4_ = (int)auVar102._0_4_;
                          auVar94._4_4_ = (int)auVar102._4_4_;
                          auVar94._8_4_ = (int)auVar102._8_4_;
                          auVar94._12_4_ = (int)auVar102._12_4_;
                          auVar102 = vpslld_avx(auVar94,0x17);
                          auVar102 = vpaddd_avx(auVar133,auVar102);
                          auVar73._0_4_ =
                               (fVar61 + 1.0 +
                               fVar61 * fVar61 *
                               (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) *
                                  fVar61 + 0.041665796) * fVar61 + 0.16666666) * fVar61 + fVar41)) *
                               auVar102._0_4_ + 1.0;
                          auVar73._4_4_ =
                               (fVar68 + 1.0 +
                               fVar68 * fVar68 *
                               (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) *
                                  fVar68 + 0.041665796) * fVar68 + 0.16666666) * fVar68 + fVar52)) *
                               auVar102._4_4_ + 1.0;
                          auVar73._8_4_ =
                               (fVar69 + 1.0 +
                               fVar69 * fVar69 *
                               (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) *
                                  fVar69 + 0.041665796) * fVar69 + 0.16666666) * fVar69 + fVar96)) *
                               auVar102._8_4_ + 1.0;
                          auVar73._12_4_ =
                               (fVar70 + 1.0 +
                               fVar70 * fVar70 *
                               (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) *
                                  fVar70 + 0.041665796) * fVar70 + 0.16666666) * fVar70 + fVar97)) *
                               auVar102._12_4_ + 1.0;
                          auVar71 = vdivps_avx(auVar133,auVar73);
                          break;
                        case 4:
                          auVar102 = vminps_avx(auVar138._0_16_,auVar71);
                          auVar140._8_4_ = 0xc2b0c0a5;
                          auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar140._12_4_ = 0xc2b0c0a5;
                          auVar56 = vmaxps_avx(auVar140,auVar102);
                          auVar109._0_4_ = auVar56._0_4_ * 1.442695 + fVar41;
                          auVar109._4_4_ = auVar56._4_4_ * 1.442695 + fVar52;
                          auVar109._8_4_ = auVar56._8_4_ * 1.442695 + fVar96;
                          auVar109._12_4_ = auVar56._12_4_ * 1.442695 + fVar97;
                          auVar125._0_4_ = (int)auVar109._0_4_;
                          auVar125._4_4_ = (int)auVar109._4_4_;
                          auVar125._8_4_ = (int)auVar109._8_4_;
                          auVar125._12_4_ = (int)auVar109._12_4_;
                          auVar103 = vcvtdq2ps_avx(auVar125);
                          auVar102 = vcmpps_avx(auVar109,auVar103,1);
                          auVar102 = vandps_avx(auVar133,auVar102);
                          auVar102 = vsubps_avx(auVar103,auVar102);
                          auVar126._0_4_ = auVar102._0_4_ * 0.6931472;
                          auVar126._4_4_ = auVar102._4_4_ * 0.6931472;
                          auVar126._8_4_ = auVar102._8_4_ * 0.6931472;
                          auVar126._12_4_ = auVar102._12_4_ * 0.6931472;
                          auVar103 = vsubps_avx(auVar56,auVar126);
                          fVar41 = auVar103._0_4_;
                          fVar52 = auVar103._4_4_;
                          fVar96 = auVar103._8_4_;
                          fVar97 = auVar103._12_4_;
                          auVar110._0_4_ = (int)auVar102._0_4_;
                          auVar110._4_4_ = (int)auVar102._4_4_;
                          auVar110._8_4_ = (int)auVar102._8_4_;
                          auVar110._12_4_ = (int)auVar102._12_4_;
                          auVar102 = vpslld_avx(auVar110,0x17);
                          auVar102 = vpaddd_avx(auVar133,auVar102);
                          auVar135._0_4_ =
                               (fVar41 + 1.0 +
                               (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) *
                                  fVar41 + 0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5) *
                               fVar41 * fVar41) * auVar102._0_4_ + 1.0;
                          auVar135._4_4_ =
                               (fVar52 + 1.0 +
                               (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                                  fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                               fVar52 * fVar52) * auVar102._4_4_ + 1.0;
                          auVar135._8_4_ =
                               (fVar96 + 1.0 +
                               (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) *
                                  fVar96 + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) *
                               fVar96 * fVar96) * auVar102._8_4_ + 1.0;
                          auVar135._12_4_ =
                               (fVar97 + 1.0 +
                               (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) *
                                  fVar97 + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) *
                               fVar97 * fVar97) * auVar102._12_4_ + 1.0;
                          auVar87._8_4_ = 0x800000;
                          auVar87._0_8_ = 0x80000000800000;
                          auVar87._12_4_ = 0x800000;
                          auVar102 = vmaxps_avx(auVar135,auVar87);
                          auVar103 = vpsrld_avx(auVar102,0x17);
                          auVar127._8_4_ = 0x807fffff;
                          auVar127._0_8_ = 0x807fffff807fffff;
                          auVar127._12_4_ = 0x807fffff;
                          auVar102 = vandps_avx(auVar102,auVar127);
                          auVar128._8_4_ = 0x3f000000;
                          auVar128._0_8_ = 0x3f0000003f000000;
                          auVar128._12_4_ = 0x3f000000;
                          auVar53 = vorps_avx(auVar102,auVar128);
                          auVar129._8_4_ = 0xffffff82;
                          auVar129._0_8_ = 0xffffff82ffffff82;
                          auVar129._12_4_ = 0xffffff82;
                          auVar102 = vpaddd_avx(auVar103,auVar129);
                          auVar56 = vcvtdq2ps_avx(auVar102);
                          auVar130._8_4_ = 0x3f3504f3;
                          auVar130._0_8_ = 0x3f3504f33f3504f3;
                          auVar130._12_4_ = 0x3f3504f3;
                          auVar103 = vcmpps_avx(auVar53,auVar130,1);
                          auVar102 = vandps_avx(auVar103,auVar53);
                          fVar41 = auVar102._0_4_ + auVar53._0_4_ + -1.0;
                          fVar52 = auVar102._4_4_ + auVar53._4_4_ + -1.0;
                          fVar96 = auVar102._8_4_ + auVar53._8_4_ + -1.0;
                          fVar97 = auVar102._12_4_ + auVar53._12_4_ + -1.0;
                          auVar102 = vandps_avx(auVar133,auVar103);
                          auVar103 = vsubps_avx(auVar56,auVar102);
                          auVar137._8_4_ = 0x42b0c0a5;
                          auVar137._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar137._12_4_ = 0x42b0c0a5;
                          auVar138 = ZEXT1664(auVar137);
                          auVar102 = vcmpps_avx(auVar135,(undefined1  [16])0x0,2);
                          auVar88._0_4_ =
                               (auVar103._0_4_ * 0.6931472 + fVar41 +
                               (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) *
                                      fVar41 + -0.12420141) * fVar41 + 0.14249323) * fVar41 +
                                   -0.16668057) * fVar41 + 0.20000714) * fVar41 + -0.24999994) *
                                 fVar41 + 0.3333333) * fVar41 + -0.5) * fVar41 * fVar41) * -2.0;
                          auVar88._4_4_ =
                               (auVar103._4_4_ * 0.6931472 + fVar52 +
                               (((((((((fVar52 * 0.070376836 + -0.1151461) * fVar52 + 0.116769984) *
                                      fVar52 + -0.12420141) * fVar52 + 0.14249323) * fVar52 +
                                   -0.16668057) * fVar52 + 0.20000714) * fVar52 + -0.24999994) *
                                 fVar52 + 0.3333333) * fVar52 + -0.5) * fVar52 * fVar52) * -2.0;
                          auVar88._8_4_ =
                               (auVar103._8_4_ * 0.6931472 + fVar96 +
                               (((((((((fVar96 * 0.070376836 + -0.1151461) * fVar96 + 0.116769984) *
                                      fVar96 + -0.12420141) * fVar96 + 0.14249323) * fVar96 +
                                   -0.16668057) * fVar96 + 0.20000714) * fVar96 + -0.24999994) *
                                 fVar96 + 0.3333333) * fVar96 + -0.5) * fVar96 * fVar96) * -2.0;
                          auVar88._12_4_ =
                               (auVar103._12_4_ * 0.6931472 + fVar97 +
                               (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 + 0.116769984) *
                                      fVar97 + -0.12420141) * fVar97 + 0.14249323) * fVar97 +
                                   -0.16668057) * fVar97 + 0.20000714) * fVar97 + -0.24999994) *
                                 fVar97 + 0.3333333) * fVar97 + -0.5) * fVar97 * fVar97) * -2.0;
                          auVar55._8_4_ = 0x7fffffff;
                          auVar55._0_8_ = 0x7fffffff7fffffff;
                          auVar55._12_4_ = 0x7fffffff;
                          auVar102 = vblendvps_avx(auVar88,auVar55,auVar102);
                          auVar102 = vminps_avx(auVar137,auVar102);
                          auVar56 = vmaxps_avx(auVar140,auVar102);
                          auVar141 = ZEXT1664(CONCAT412(0x80000000,
                                                        CONCAT48(0x80000000,0x8000000080000000)));
                          auVar111._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
                          auVar111._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
                          auVar111._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
                          auVar111._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
                          auVar131._0_4_ = (int)auVar111._0_4_;
                          auVar131._4_4_ = (int)auVar111._4_4_;
                          auVar131._8_4_ = (int)auVar111._8_4_;
                          auVar131._12_4_ = (int)auVar111._12_4_;
                          auVar103 = vcvtdq2ps_avx(auVar131);
                          auVar102 = vcmpps_avx(auVar111,auVar103,1);
                          auVar102 = vandps_avx(auVar133,auVar102);
                          auVar102 = vsubps_avx(auVar103,auVar102);
                          auVar132._0_4_ = auVar102._0_4_ * 0.6931472;
                          auVar132._4_4_ = auVar102._4_4_ * 0.6931472;
                          auVar132._8_4_ = auVar102._8_4_ * 0.6931472;
                          auVar132._12_4_ = auVar102._12_4_ * 0.6931472;
                          auVar103 = vsubps_avx(auVar56,auVar132);
                          fVar41 = auVar103._0_4_;
                          fVar52 = auVar103._4_4_;
                          fVar96 = auVar103._8_4_;
                          fVar97 = auVar103._12_4_;
                          auVar60 = ZEXT1664(CONCAT412(0x3f000000,
                                                       CONCAT48(0x3f000000,0x3f0000003f000000)));
                          auVar112._0_4_ = (int)auVar102._0_4_;
                          auVar112._4_4_ = (int)auVar102._4_4_;
                          auVar112._8_4_ = (int)auVar102._8_4_;
                          auVar112._12_4_ = (int)auVar102._12_4_;
                          auVar102 = vpslld_avx(auVar112,0x17);
                          auVar102 = vpaddd_avx(auVar133,auVar102);
                          auVar89._0_4_ =
                               (fVar41 + 1.0 +
                               (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) *
                                  fVar41 + 0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5) *
                               fVar41 * fVar41) * auVar102._0_4_ + 1.0;
                          auVar89._4_4_ =
                               (fVar52 + 1.0 +
                               (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                                  fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                               fVar52 * fVar52) * auVar102._4_4_ + 1.0;
                          auVar89._8_4_ =
                               (fVar96 + 1.0 +
                               (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) *
                                  fVar96 + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) *
                               fVar96 * fVar96) * auVar102._8_4_ + 1.0;
                          auVar89._12_4_ =
                               (fVar97 + 1.0 +
                               (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) *
                                  fVar97 + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) *
                               fVar97 * fVar97) * auVar102._12_4_ + 1.0;
                          auVar113._8_4_ = 0x40000000;
                          auVar113._0_8_ = 0x4000000040000000;
                          auVar113._12_4_ = 0x40000000;
                          auVar102 = vdivps_avx(auVar113,auVar89);
                          auVar90._0_4_ = auVar102._0_4_ + -1.0;
                          auVar90._4_4_ = auVar102._4_4_ + -1.0;
                          auVar90._8_4_ = auVar102._8_4_ + -1.0;
                          auVar90._12_4_ = auVar102._12_4_ + -1.0;
                          goto LAB_0042b217;
                        case 5:
                          pfVar49 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                             data;
                          fVar41 = *pfVar49;
                          fVar52 = pfVar49[1];
                          auVar95._0_4_ = fVar41 * fVar61 + fVar52;
                          auVar95._4_4_ = fVar41 * fVar68 + fVar52;
                          auVar95._8_4_ = fVar41 * fVar69 + fVar52;
                          auVar95._12_4_ = fVar41 * fVar70 + fVar52;
                          auVar102 = vmaxps_avx(auVar95,(undefined1  [16])0x0);
                          auVar90 = vminps_avx(auVar133,auVar102);
LAB_0042b217:
                          auVar71._0_4_ = auVar90._0_4_ * fVar61;
                          auVar71._4_4_ = auVar90._4_4_ * fVar68;
                          auVar71._8_4_ = auVar90._8_4_ * fVar69;
                          auVar71._12_4_ = auVar90._12_4_ * fVar70;
                        }
                        if (iVar29 < 0x65) {
                          *pauVar46 = auVar62;
                          pauVar46[1] = auVar71;
                          pauVar46 = pauVar46 + 2;
                        }
                        else {
                          pvVar3 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                          pfVar49 = (float *)((long)pvVar3 + local_308 * 0x20);
                          auVar65._0_4_ = auVar62._0_4_ * *pfVar49;
                          auVar65._4_4_ = auVar62._4_4_ * pfVar49[1];
                          auVar65._8_4_ = auVar62._8_4_ * pfVar49[2];
                          auVar65._12_4_ = auVar62._12_4_ * pfVar49[3];
                          pfVar49 = (float *)((long)pvVar3 + local_308 * 0x20 + 0x10);
                          auVar74._0_4_ = auVar71._0_4_ * *pfVar49;
                          auVar74._4_4_ = auVar71._4_4_ * pfVar49[1];
                          auVar74._8_4_ = auVar71._8_4_ * pfVar49[2];
                          auVar74._12_4_ = auVar71._12_4_ * pfVar49[3];
                          auVar102 = vandps_avx(auVar141._0_16_,auVar65);
                          auVar103 = vandps_avx(auVar141._0_16_,auVar74);
                          auVar102 = vorps_avx(auVar102,auVar60._0_16_);
                          auVar103 = vorps_avx(auVar103,auVar60._0_16_);
                          auVar66._0_4_ = (int)(auVar65._0_4_ + auVar102._0_4_);
                          auVar66._4_4_ = (int)(auVar65._4_4_ + auVar102._4_4_);
                          auVar66._8_4_ = (int)(auVar65._8_4_ + auVar102._8_4_);
                          auVar66._12_4_ = (int)(auVar65._12_4_ + auVar102._12_4_);
                          auVar75._0_4_ = (int)(auVar74._0_4_ + auVar103._0_4_);
                          auVar75._4_4_ = (int)(auVar74._4_4_ + auVar103._4_4_);
                          auVar75._8_4_ = (int)(auVar74._8_4_ + auVar103._8_4_);
                          auVar75._12_4_ = (int)(auVar74._12_4_ + auVar103._12_4_);
                          auVar102 = vpackssdw_avx(auVar66,auVar75);
                          auVar102 = vpminsw_avx(auVar102,_DAT_005fa820);
                          auVar102 = vpmaxsw_avx(auVar102,_DAT_005fa830);
                          auVar102 = vpacksswb_avx(auVar102,auVar102);
                          *(long *)*pauVar47 = auVar102._0_8_;
                          pauVar47 = (undefined1 (*) [16])((long)*pauVar47 + 8);
                        }
                        bVar51 = iVar40 != iVar38;
                        iVar40 = iVar40 + 1;
                      } while (bVar51);
                    }
                    uVar39 = (ulong)(iVar48 + 1);
                  } while (iVar48 != (int)local_1d0);
                }
                local_308 = local_308 + 1;
                local_290 = (ulong)(uint)((int)local_290 + (int)uVar36 * 8);
                local_1d8 = uVar34;
              } while (local_308 != uVar34);
            }
            if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2e8._0_8_,
                              CONCAT44(local_2e8._20_4_,local_2e8._16_4_) - local_2e8._0_8_);
            }
          }
          local_320 = 0;
          local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
        }
      }
    }
    else {
      iVar38 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar36 = 1;
      if (opt->use_packing_layout == true) {
        uVar44 = (this->super_ConvolutionDepthWise).num_output;
        if (iVar38 < 0x65) {
          uVar36 = (ulong)((uint)((uVar44 & 3) == 0) * 3 + 1);
        }
        else {
          uVar36 = 1;
          if ((uVar44 & 7) == 0) {
            uVar36 = 8;
          }
        }
      }
      local_320 = -100;
      uVar44 = (uint)uVar36;
      uVar34 = (ulong)(uVar44 * 4);
      if (100 < iVar38) {
        uVar34 = uVar36;
      }
      local_288 = CONCAT44(local_288._4_4_,iVar48);
      Mat::create(top_blob,iVar40,iVar48,(this->super_ConvolutionDepthWise).num_output / (int)uVar44
                  ,uVar34,uVar44,opt->blob_allocator);
      auVar25 = local_2c8;
      local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
      if ((top_blob->data != (void *)0x0) &&
         (local_2e8._8_8_ = (Allocator *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_),
         (long)top_blob->c * top_blob->cstep != 0)) {
        iVar48 = (this->super_ConvolutionDepthWise).group;
        uVar37 = (int)uVar37 / iVar48;
        uVar28 = (this->super_ConvolutionDepthWise).num_output / iVar48;
        local_298 = (float *)CONCAT44(local_298._4_4_,uVar28);
        iVar48 = 1;
        _elempack = 1;
        if (opt->use_packing_layout == true) {
          iVar48 = 1;
          if ((uVar37 & 7) == 0) {
            iVar48 = 8;
          }
          if (iVar38 < 0x65) {
            _elempack = (uint)((uVar28 & 3) == 0) * 3 + 1;
          }
          else {
            _elempack = 1;
            if ((uVar28 & 7) == 0) {
              _elempack = 8;
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
        local_2e8._0_8_ = local_278.data;
        local_2e8._8_4_ = local_278.refcount._0_4_;
        local_2e8._12_4_ = local_278.refcount._4_4_;
        local_2e8._16_4_ = (undefined4)local_278.elemsize;
        local_2e8._20_4_ = (undefined4)(local_278.elemsize >> 0x20);
        local_2e8._24_4_ = local_278.elempack;
        local_2c8._12_4_ = local_278.w;
        local_2c8._8_4_ = local_278.dims;
        local_2c8._20_4_ = local_278.d;
        local_2c8._16_4_ = local_278.h;
        local_2c8._0_8_ = local_278.allocator;
        local_2c8._28_4_ = auVar25._28_4_;
        local_2c8._24_4_ = local_278.c;
        local_2a8 = local_278.cstep;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        if (iVar48 < iVar50) {
          local_228.data = *(void **)opt;
          uVar16 = opt->openmp_blocktime;
          uVar17 = opt->use_winograd_convolution;
          uVar19 = opt->use_sgemm_convolution;
          uVar21 = opt->use_int8_inference;
          uVar23 = opt->use_vulkan_compute;
          uVar22 = CONCAT11(uVar23,uVar21);
          uVar20 = CONCAT21(uVar22,uVar19);
          uVar18 = CONCAT31(uVar20,uVar17);
          local_228.allocator = *(Allocator **)&opt->use_bf16_storage;
          local_228._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
          local_228._48_8_ = *(undefined8 *)&opt->flush_denormals;
          local_228.c._0_1_ = opt->use_winograd43_convolution;
          local_228.c._1_1_ = opt->use_winograd63_convolution;
          local_228.c._2_1_ = opt->use_a53_a55_optimized_kernel;
          local_228.c._3_1_ = opt->use_fp16_uniform;
          local_228._60_1_ = opt->use_int8_uniform;
          local_228._61_1_ = opt->use_reserved_9;
          local_228._62_1_ = opt->use_reserved_10;
          local_228._63_1_ = opt->use_reserved_11;
          local_228.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
          local_228.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
          local_228.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
          local_228.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
          local_228.elempack = uVar16;
          local_228._28_4_ = uVar18;
          convert_packing(&local_278,(Mat *)local_2e8,iVar48,(Option *)&local_228);
          if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
            if ((long)(int)local_2c8._24_4_ * local_2a8 != 0) goto LAB_0042b800;
          }
          local_320 = -100;
        }
        else {
LAB_0042b800:
          piVar1 = top_blob->refcount;
          local_228.data = top_blob->data;
          local_228.refcount._0_4_ = SUB84(top_blob->refcount,0);
          local_228.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
          local_228.elemsize._0_4_ = (undefined4)top_blob->elemsize;
          local_228.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
          local_228.elempack = top_blob->elempack;
          local_228.allocator = top_blob->allocator;
          local_228.dims = top_blob->dims;
          local_228.w = top_blob->w;
          local_228.h = top_blob->h;
          local_228.d = top_blob->d;
          local_228.c = top_blob->c;
          local_228.cstep = top_blob->cstep;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          if (_elempack < uVar44) {
            Mat::create(&local_228,iVar40,(int)local_288,
                        (this->super_ConvolutionDepthWise).num_output / (int)_elempack,
                        (ulong)((int)(uVar34 / uVar36) * _elempack),_elempack,
                        opt->workspace_allocator);
            local_320 = -100;
            if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0))
            goto LAB_0042b8d6;
          }
          else {
LAB_0042b8d6:
            iVar38 = (this->super_ConvolutionDepthWise).group;
            bVar51 = 0 < iVar38;
            if (iVar38 < 1) {
              local_320 = -100;
            }
            else {
              local_288 = CONCAT44(local_288._4_4_,(int)uVar37 / iVar48);
              local_290 = CONCAT44(local_290._4_4_,(int)local_298 / (int)_elempack);
              local_320 = -100;
              iVar38 = 0;
              iVar40 = 0;
              lVar31 = 0;
              do {
                auVar25 = local_2c8;
                local_138 = CONCAT44(local_2e8._20_4_,local_2e8._16_4_);
                local_178 = (pointer)((long)(iVar38 / iVar48) * local_2a8 * local_138 +
                                     local_2e8._0_8_);
                uStack_170 = 0;
                uStack_16c = 0;
                local_168 = local_2e8._16_4_;
                uStack_164 = local_2e8._20_4_;
                local_160 = local_2e8._24_4_;
                local_158 = (Allocator *)local_2c8._0_8_;
                local_140 = (int)local_288;
                uVar24 = local_2c8._8_8_;
                uVar26 = local_2c8._16_8_;
                local_138 = ((long)(int)local_2c8._20_4_ * local_138 *
                             (long)(int)local_2c8._16_4_ * (long)(int)local_2c8._12_4_ + 0xf &
                            0xfffffffffffffff0) / local_138;
                local_2c8._8_4_ = (undefined4)uVar24;
                local_2c8._12_4_ = SUB84(uVar24,4);
                local_150._0_4_ = local_2c8._8_4_;
                local_150._4_4_ = local_2c8._12_4_;
                local_2c8._16_4_ = (undefined4)uVar26;
                local_2c8._20_4_ = SUB84(uVar26,4);
                uStack_148._0_4_ = local_2c8._16_4_;
                uStack_148._4_4_ = local_2c8._20_4_;
                local_e8 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
                local_128 = (void *)((long)(iVar40 / (int)_elempack) * local_228.cstep * local_e8 +
                                    (long)local_228.data);
                uStack_120 = 0;
                uStack_11c = 0;
                local_118 = (undefined4)local_228.elemsize;
                uStack_114 = local_228.elemsize._4_4_;
                local_110 = local_228.elempack;
                local_108 = local_228.allocator;
                local_f0 = (int)local_290;
                local_e8 = ((long)local_228.d * local_e8 * (long)local_228.h * (long)local_228.w +
                            0xf & 0xfffffffffffffff0) / local_e8;
                local_100._0_4_ = local_228.dims;
                local_100._4_4_ = local_228.w;
                uStack_f8._0_4_ = local_228.h;
                uStack_f8._4_4_ = local_228.d;
                pLVar7 = (this->group_ops).
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar31];
                local_78._0_1_ = opt->lightmode;
                local_78._1_1_ = opt->use_shader_pack8;
                local_78._2_1_ = opt->use_subgroup_ops;
                local_78._3_1_ = opt->use_reserved_0;
                local_78._4_4_ = opt->num_threads;
                pAStack_68 = opt->workspace_allocator;
                uStack_60._0_4_ = opt->openmp_blocktime;
                uStack_60._4_1_ = opt->use_winograd_convolution;
                uStack_60._5_1_ = opt->use_sgemm_convolution;
                uStack_60._6_1_ = opt->use_int8_inference;
                uStack_60._7_1_ = opt->use_vulkan_compute;
                local_58._0_1_ = opt->use_bf16_storage;
                local_58._1_1_ = opt->use_fp16_packed;
                local_58._2_1_ = opt->use_fp16_storage;
                local_58._3_1_ = opt->use_fp16_arithmetic;
                local_58._4_1_ = opt->use_int8_packed;
                local_58._5_1_ = opt->use_int8_storage;
                local_58._6_1_ = opt->use_int8_arithmetic;
                local_58._7_1_ = opt->use_packing_layout;
                uStack_50._0_4_ = opt->vulkan_device_index;
                uStack_50._4_1_ = opt->use_reserved_1;
                uStack_50._5_1_ = opt->use_image_storage;
                uStack_50._6_1_ = opt->use_tensor_storage;
                uStack_50._7_1_ = opt->use_reserved_2;
                uStack_48._0_4_ = opt->flush_denormals;
                uStack_48._4_1_ = opt->use_local_pool_allocator;
                uStack_48._5_1_ = opt->use_shader_local_memory;
                uStack_48._6_1_ = opt->use_cooperative_matrix;
                uStack_48._7_1_ = opt->use_winograd23_convolution;
                uStack_40._0_1_ = opt->use_winograd43_convolution;
                uStack_40._1_1_ = opt->use_winograd63_convolution;
                uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
                uStack_40._3_1_ = opt->use_fp16_uniform;
                uStack_40._4_1_ = opt->use_int8_uniform;
                uStack_40._5_1_ = opt->use_reserved_9;
                uStack_40._6_1_ = opt->use_reserved_10;
                uStack_40._7_1_ = opt->use_reserved_11;
                pAStack_70 = local_228.allocator;
                local_2c8 = auVar25;
                iVar29 = (*pLVar7->_vptr_Layer[7])(pLVar7,&local_178,&local_128,&local_78);
                if (iVar29 != 0) {
                  local_320 = iVar29;
                }
                piVar1 = (int *)CONCAT44(uStack_11c,uStack_120);
                if (piVar1 != (int *)0x0) {
                  LOCK();
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (*piVar1 == 0) {
                    if (local_108 == (Allocator *)0x0) {
                      if (local_128 != (void *)0x0) {
                        free(local_128);
                      }
                    }
                    else {
                      (*local_108->_vptr_Allocator[3])();
                    }
                  }
                }
                local_e8 = 0;
                local_128 = (void *)0x0;
                uStack_120 = 0;
                uStack_11c = 0;
                local_118 = 0;
                uStack_114 = 0;
                local_110 = 0;
                local_100 = 0;
                uStack_f8 = 0;
                local_f0 = 0;
                piVar1 = (int *)CONCAT44(uStack_16c,uStack_170);
                if (piVar1 != (int *)0x0) {
                  LOCK();
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (*piVar1 == 0) {
                    if (local_158 == (Allocator *)0x0) {
                      if (local_178 != (pointer)0x0) {
                        free(local_178);
                      }
                    }
                    else {
                      (*local_158->_vptr_Allocator[3])();
                    }
                  }
                }
                local_138 = 0;
                local_178 = (pointer)0x0;
                uStack_170 = 0;
                uStack_16c = 0;
                local_168 = 0;
                uStack_164 = 0;
                local_160 = 0;
                local_150 = 0;
                uStack_148 = 0;
                local_140 = 0;
                if (iVar29 != 0) break;
                lVar31 = lVar31 + 1;
                lVar43 = (long)(this->super_ConvolutionDepthWise).group;
                iVar40 = iVar40 + (int)local_298;
                iVar38 = iVar38 + uVar37;
                bVar51 = lVar31 < lVar43;
              } while (lVar31 < lVar43);
            }
            if (!bVar51) {
              if (_elempack < uVar44) {
                convert_packing(&local_228,top_blob,uVar44,opt);
                local_320 = -100;
                if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
                goto LAB_0042c592;
              }
              else if (&local_228 != top_blob) {
                piVar1 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
                if (piVar1 != (int *)0x0) {
                  LOCK();
                  *piVar1 = *piVar1 + 1;
                  UNLOCK();
                }
                piVar1 = top_blob->refcount;
                if (piVar1 != (int *)0x0) {
                  LOCK();
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (*piVar1 == 0) {
                    if (top_blob->allocator == (Allocator *)0x0) {
                      if (top_blob->data != (void *)0x0) {
                        free(top_blob->data);
                      }
                    }
                    else {
                      (*top_blob->allocator->_vptr_Allocator[3])();
                    }
                  }
                }
                top_blob->cstep = 0;
                top_blob->data = (void *)0x0;
                top_blob->refcount = (int *)0x0;
                *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
                *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
                top_blob->dims = 0;
                top_blob->w = 0;
                top_blob->h = 0;
                top_blob->d = 0;
                top_blob->c = 0;
                top_blob->data = local_228.data;
                top_blob->refcount =
                     (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
                top_blob->elemsize =
                     CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
                top_blob->elempack = local_228.elempack;
                top_blob->allocator = local_228.allocator;
                top_blob->dims = local_228.dims;
                top_blob->w = local_228.w;
                top_blob->h = local_228.h;
                top_blob->d = local_228.d;
                top_blob->c = local_228.c;
                top_blob->cstep = local_228.cstep;
              }
              local_320 = 0;
            }
          }
LAB_0042c592:
          piVar1 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (local_228.allocator == (Allocator *)0x0) {
                if (local_228.data != (void *)0x0) {
                  free(local_228.data);
                }
              }
              else {
                (*(local_228.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_228.cstep = 0;
          local_228.data = (void *)0x0;
          local_228.refcount._0_4_ = 0;
          local_228.refcount._4_4_ = 0;
          local_228.elemsize._0_4_ = 0;
          local_228.elemsize._4_4_ = 0;
          local_228.elempack = 0;
          local_228.dims = 0;
          local_228.w = 0;
          local_228.h = 0;
          local_228.d = 0;
          local_228._56_8_ = local_228._56_8_ & 0xffffffff00000000;
        }
        piVar1 = (int *)CONCAT44(local_2e8._12_4_,local_2e8._8_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if ((Allocator *)local_2c8._0_8_ == (Allocator *)0x0) {
              if ((pointer)local_2e8._0_8_ != (pointer)0x0) {
                free((void *)local_2e8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_2c8._0_8_)[3])();
            }
          }
        }
        local_2a8 = 0;
        local_2e8._0_8_ = (pointer)0x0;
        local_2e8._8_8_ = (Allocator *)0x0;
        local_2e8._16_4_ = 0;
        local_2e8._20_4_ = 0;
        local_2e8._24_4_ = 0;
        local_2c8._0_28_ = ZEXT828((ulong)local_2c8._0_8_);
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if ((pointer)local_278.data != (pointer)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0042b58c:
  local_278.cstep = 0;
  local_278.c = 0;
  local_278.d = 0;
  local_278.h = 0;
  local_278.w = 0;
  local_278.dims = 0;
  local_278.elempack = 0;
  local_278.elemsize = 0;
  local_278.refcount._4_4_ = 0;
  local_278.refcount._0_4_ = 0;
  local_278.data = (void *)0x0;
  piVar1 = (int *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if ((Allocator *)local_1c8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1c8._0_8_ != (void *)0x0) {
          free((void *)local_1c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1c8._32_8_)[3])();
      }
    }
  }
  return local_320;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}